

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::File::dup(File *this,int __fd)

{
  undefined8 uVar1;
  int *in_stack_00000018;
  int in_stack_00000024;
  SystemError *in_stack_00000028;
  CStringRef in_stack_00000030;
  int new_fd;
  BasicCStringRef<char> local_18;
  int local_10;
  int local_c;
  File *local_8;
  
  local_c = __fd;
  local_8 = this;
  local_10 = ::dup(__fd);
  if (local_10 == -1) {
    uVar1 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_18,"cannot duplicate file descriptor {}");
    SystemError::SystemError<int>
              (in_stack_00000028,in_stack_00000024,in_stack_00000030,in_stack_00000018);
    __cxa_throw(uVar1,&SystemError::typeinfo,SystemError::~SystemError);
  }
  File(this,local_10);
  return (int)this;
}

Assistant:

fmt::File fmt::File::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(SystemError(errno, "cannot duplicate file descriptor {}", fd));
  return File(new_fd);
}